

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathParser.cpp
# Opt level: O0

bool ConvertExpression(wstring *exp,int *Result)

{
  bool bVar1;
  char *Infix;
  wstring local_80 [48];
  undefined1 local_50 [8];
  CExpressionCommandList ExpList;
  CStringList List;
  int *Result_local;
  wstring *exp_local;
  
  CStringList::CStringList((CStringList *)&ExpList.initialized);
  CExpressionCommandList::CExpressionCommandList((CExpressionCommandList *)local_50);
  convertWStringToUtf8(local_80);
  Infix = (char *)std::__cxx11::string::c_str();
  bVar1 = ConvertInfixToPostfix(Infix,(CStringList *)&ExpList.initialized);
  std::__cxx11::string::~string((string *)local_80);
  if (bVar1) {
    bVar1 = CheckPostfix((CStringList *)&ExpList.initialized,false);
    if (bVar1) {
      bVar1 = CExpressionCommandList::Load
                        ((CExpressionCommandList *)local_50,(CStringList *)&ExpList.initialized);
      if (bVar1) {
        bVar1 = ParsePostfix((CExpressionCommandList *)local_50,(CStringList *)0x0,Result);
        if (bVar1) {
          exp_local._7_1_ = true;
        }
        else {
          exp_local._7_1_ = false;
        }
      }
      else {
        exp_local._7_1_ = false;
      }
    }
    else {
      exp_local._7_1_ = false;
    }
  }
  else {
    exp_local._7_1_ = false;
  }
  CExpressionCommandList::~CExpressionCommandList((CExpressionCommandList *)local_50);
  CStringList::~CStringList((CStringList *)&ExpList.initialized);
  return exp_local._7_1_;
}

Assistant:

bool ConvertExpression(const std::wstring& exp, int& Result)
{
	CStringList List;
	CExpressionCommandList ExpList;
	if (ConvertInfixToPostfix((char*)convertWStringToUtf8(exp).c_str(),List) == false) return false;
	if (CheckPostfix(List,false) == false) return false;
	if (ExpList.Load(List) == false) return false;
	if (ParsePostfix(ExpList,NULL,Result) == false) return false;
	return true;
}